

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void dpfb::writeImages(Font *font,ImageNameFormatter *imageNameFormatter,ImageWriter *imageWriter,
                      ExportOptions *exportOptions)

{
  int imageMaxSize_00;
  uint uVar1;
  int iVar2;
  int w;
  int h;
  bool bVar3;
  int iVar4;
  int pitch;
  int iVar5;
  vector<dpfb::Page,_std::allocator<dpfb::Page>_> *pages_00;
  FontBakingOptions *pFVar6;
  size_type sVar7;
  uint8_t *puVar8;
  const_reference pageSize;
  reference puVar9;
  vector<dpfb::Glyph,_std::allocator<dpfb::Glyph>_> *this;
  Size SVar10;
  runtime_error *e;
  FileStream f;
  Image image;
  Size imageSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> imagePath;
  FontRendererError *e_1;
  Image glyphImage;
  value_type *glyph;
  const_iterator cStack_a8;
  uint glyphIdx;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  value_type *page;
  ulong local_78;
  size_t pageIdx;
  Image canvas;
  int iStack_38;
  Size canvasSize;
  int imageMaxSize;
  vector<dpfb::Page,_std::allocator<dpfb::Page>_> *pages;
  ExportOptions *exportOptions_local;
  ImageWriter *imageWriter_local;
  ImageNameFormatter *imageNameFormatter_local;
  Font *font_local;
  
  pages_00 = Font::getPages(font);
  pFVar6 = Font::getBakingOptions(font);
  imageMaxSize_00 = pFVar6->imageMaxSize;
  register0x00000000 = getMaxImageSize(pages_00,exportOptions->imageSizeMode,imageMaxSize_00);
  Image::Image((Image *)&pageIdx,
               canvas.ownData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,iStack_38);
  local_78 = 0;
  while( true ) {
    sVar7 = std::vector<dpfb::Page,_std::allocator<dpfb::Page>_>::size(pages_00);
    if (sVar7 <= local_78) break;
    puVar8 = Image::getData((Image *)&pageIdx);
    memset(puVar8,0,(long)canvas.ownData.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_ * (long)iStack_38);
    pageSize = std::vector<dpfb::Page,_std::allocator<dpfb::Page>_>::operator[](pages_00,local_78);
    __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       (&pageSize->glyphIndices);
    cStack_a8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                          (&pageSize->glyphIndices);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff58);
      if (!bVar3) break;
      puVar9 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end2);
      uVar1 = *puVar9;
      this = Font::getGlyphs(font);
      glyphImage.ownData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<dpfb::Glyph,_std::allocator<dpfb::Glyph>_>::operator[]
                              (this,(ulong)uVar1);
      puVar8 = Image::getData((Image *)&pageIdx);
      iVar5 = *(int *)(glyphImage.ownData.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 0x24);
      iVar4 = Image::getPitch((Image *)&pageIdx);
      iVar2 = *(int *)(glyphImage.ownData.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 0x20);
      w = *(int *)(glyphImage.ownData.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 8);
      h = *(int *)(glyphImage.ownData.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 0xc);
      pitch = Image::getPitch((Image *)&pageIdx);
      Image::Image((Image *)&e_1,puVar8 + (long)iVar2 + (long)(iVar5 * iVar4),w,h,pitch);
      Font::renderGlyph(font,*(GlyphIndex *)
                              (glyphImage.ownData.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 4),(Image *)&e_1)
      ;
      Image::~Image((Image *)&e_1);
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end2);
    }
    ImageNameFormatter::getImageName_abi_cxx11_
              ((ImageNameFormatter *)&imageSize,(size_t)imageNameFormatter);
    std::operator+(local_138,&exportOptions->outDir);
    std::__cxx11::string::~string((string *)&imageSize);
    SVar10 = getImageSize(&pageSize->size,exportOptions->imageSizeMode,imageMaxSize_00);
    puVar8 = Image::getData((Image *)&pageIdx);
    image.ownData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = SVar10.w;
    image.ownData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = SVar10.h;
    iVar5 = Image::getPitch((Image *)&pageIdx);
    Image::Image((Image *)&f.fp,puVar8,
                 (int)image.ownData.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                 image.ownData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,iVar5);
    streams::FileStream::FileStream((FileStream *)&e,local_138,"wb");
    (*imageWriter->_vptr_ImageWriter[3])(imageWriter,&e,&f.fp);
    streams::FileStream::~FileStream((FileStream *)&e);
    Image::~Image((Image *)&f.fp);
    std::__cxx11::string::~string((string *)local_138);
    local_78 = local_78 + 1;
  }
  Image::~Image((Image *)&pageIdx);
  return;
}

Assistant:

static void writeImages(
    const Font& font, const ImageNameFormatter& imageNameFormatter,
    const ImageWriter& imageWriter, const ExportOptions& exportOptions)
{
    const auto& pages = font.getPages();
    const auto imageMaxSize = font.getBakingOptions().imageMaxSize;

    const auto canvasSize = getMaxImageSize(
        pages, exportOptions.imageSizeMode, imageMaxSize);

    Image canvas(canvasSize.w, canvasSize.h);

    for (std::size_t pageIdx = 0; pageIdx < pages.size(); ++pageIdx) {
        std::memset(
            canvas.getData(),
            0,
            static_cast<std::size_t>(canvasSize.w) * canvasSize.h);

        const auto& page = pages[pageIdx];
        for (const auto glyphIdx : page.glyphIndices) {
            const auto& glyph = font.getGlyphs()[glyphIdx];

            Image glyphImage(
                canvas.getData()
                    + glyph.pagePos.y * canvas.getPitch() + glyph.pagePos.x,
                glyph.size.w,
                glyph.size.h,
                canvas.getPitch());
            try {
                font.renderGlyph(glyph.glyphIdx, glyphImage);
            } catch (FontRendererError& e) {
                throw std::runtime_error(str::format(
                    "%s font renderer can't render glyph for %s: %s",
                    font.getBakingOptions().fontRenderer.c_str(),
                    unicode::cpToStr(glyph.cp),
                    e.what()));
            }
        }

        const auto imagePath = (
            exportOptions.outDir + imageNameFormatter.getImageName(pageIdx));
        const auto imageSize = getImageSize(
            page.size, exportOptions.imageSizeMode, imageMaxSize);
        const Image image(
            canvas.getData(),
            imageSize.w,
            imageSize.h,
            canvas.getPitch());
        try {
            streams::FileStream f(imagePath, "wb");
            imageWriter.write(f, image);
        } catch (std::runtime_error& e) {
            // ImageWriterError and StreamError
            throw std::runtime_error(str::format(
                "%s image writer can't write \"%s\": %s",
                imageWriter.getName(),
                imagePath.c_str(),
                e.what()));
        }
    }
}